

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::TextureVkImpl::CreateStagingTexture
          (TextureVkImpl *this,TextureData *pInitData,TextureFormatAttribs *FmtAttribs)

{
  CPU_ACCESS_FLAGS CVar1;
  CPU_ACCESS_FLAGS CVar2;
  bool bVar3;
  Uint32 UVar4;
  RenderDeviceVkImpl *pRVar5;
  VulkanLogicalDevice *this_00;
  Uint64 UVar6;
  Char *pCVar7;
  VulkanPhysicalDevice *this_01;
  VkPhysicalDeviceProperties *pVVar8;
  char *DebugName;
  VkBuffer_T *pVVar9;
  VkDeviceMemory memory;
  uint8_t *puVar10;
  char (*Args_1) [118];
  ulong uVar11;
  bool bVar12;
  Uint64 DstSubresOffset;
  MipLevelProperties MipProps;
  TextureSubResData *SubResData;
  uint local_1c0;
  Uint32 mip;
  Uint32 layer;
  Uint32 subres;
  uint8_t *pStagingData;
  VkResult local_1a4;
  undefined1 local_1a0 [4];
  VkResult err;
  string msg_4;
  VkDeviceSize AlignedStagingMemOffset;
  VkDeviceMemory StagingBufferMemory;
  undefined1 local_158 [8];
  string msg_3;
  VkMemoryRequirements StagingBufferMemReqs;
  allocator local_101;
  string local_100 [8];
  string StagingBufferName;
  string msg_2;
  VkPhysicalDeviceLimits *DeviceLimits;
  string msg_1;
  VkMemoryPropertyFlags MemProperties;
  undefined1 local_88 [8];
  string msg;
  VkBufferCreateInfo VkStagingBuffCI;
  VulkanLogicalDevice *LogicalDevice;
  bool bInitializeTexture;
  TextureFormatAttribs *FmtAttribs_local;
  TextureData *pInitData_local;
  TextureVkImpl *this_local;
  
  bVar12 = false;
  if ((pInitData != (TextureData *)0x0) &&
     (bVar12 = false, pInitData->pSubResources != (TextureSubResData *)0x0)) {
    bVar12 = pInitData->NumSubresources != 0;
  }
  pRVar5 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pRVar5);
  memset((void *)((long)&msg.field_2 + 8),0,0x38);
  msg.field_2._8_4_ = 0xc;
  UVar6 = GetStagingTextureDataSize
                    (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc,0x10);
  CVar2 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.CPUAccessFlags;
  CVar1 = Diligent::operator|(CPU_ACCESS_READ,CPU_ACCESS_FLAG_LAST);
  CVar2 = Diligent::operator&(CVar2,CVar1);
  if (CVar2 != CPU_ACCESS_READ) {
    CVar2 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc.CPUAccessFlags;
    CVar1 = Diligent::operator|(CPU_ACCESS_READ,CPU_ACCESS_FLAG_LAST);
    CVar2 = Diligent::operator&(CVar2,CVar1);
    if (CVar2 != CPU_ACCESS_FLAG_LAST) {
      FormatString<char[75]>
                ((string *)local_88,
                 (char (*) [75])
                 "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x256);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  msg_1.field_2._8_4_ = 2;
  CVar2 = Diligent::operator&((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                              .m_Desc.CPUAccessFlags,CPU_ACCESS_READ);
  if (CVar2 == CPU_ACCESS_NONE) {
    CVar2 = Diligent::operator&((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                                .m_Desc.CPUAccessFlags,CPU_ACCESS_FLAG_LAST);
    if (CVar2 == CPU_ACCESS_NONE) {
      FormatString<char[22]>
                ((string *)((long)&StagingBufferName.field_2 + 8),
                 (char (*) [22])"Unexpected CPU access");
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x271);
      std::__cxx11::string::~string((string *)(StagingBufferName.field_2._M_local_buf + 8));
    }
    else {
      msg_1.field_2._8_4_ = msg_1.field_2._8_4_ | 4;
      TextureBase<Diligent::EngineVkImplTraits>::SetState
                (&this->super_TextureBase<Diligent::EngineVkImplTraits>,RESOURCE_STATE_COPY_SOURCE);
    }
  }
  else {
    if (bVar12) {
      FormatString<char[54]>
                ((string *)&DeviceLimits,
                 (char (*) [54])"Readback textures should not be initialized with data");
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x25b);
      std::__cxx11::string::~string((string *)&DeviceLimits);
    }
    msg_1.field_2._8_4_ = msg_1.field_2._8_4_ | 8;
    TextureBase<Diligent::EngineVkImplTraits>::SetState
              (&this->super_TextureBase<Diligent::EngineVkImplTraits>,RESOURCE_STATE_COPY_DEST);
    pRVar5 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)this);
    this_01 = RenderDeviceVkImpl::GetPhysicalDevice(pRVar5);
    pVVar8 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(this_01);
    AlignUp<unsigned_long,unsigned_long>(UVar6,(pVVar8->limits).nonCoherentAtomSize);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"Staging buffer for \'",&local_101);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::operator+=
            (local_100,
             (this->super_TextureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  std::__cxx11::string::operator+=(local_100,'\'');
  DebugName = (char *)std::__cxx11::string::c_str();
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&StagingBufferMemReqs.memoryTypeBits,this_00,
             (VkBufferCreateInfo *)((long)&msg.field_2 + 8),DebugName);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_StagingBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
            &StagingBufferMemReqs.memoryTypeBits);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &StagingBufferMemReqs.memoryTypeBits);
  pVVar9 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&this->m_StagingBuffer);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)((long)&msg_3.field_2 + 8),this_00,pVVar9);
  bVar3 = IsPowerOfTwo<unsigned_long>(StagingBufferMemReqs.size);
  if (!bVar3) {
    FormatString<char[29]>((string *)local_158,(char (*) [29])"Alignment is not power of 2!");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x27d);
    std::__cxx11::string::~string((string *)local_158);
  }
  pRVar5 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)&StagingBufferMemory,pRVar5,
             (VkMemoryRequirements *)((long)&msg_3.field_2 + 8),msg_1.field_2._8_4_,0);
  VulkanUtilities::VulkanMemoryAllocation::operator=
            (&this->m_MemoryAllocation,(VulkanMemoryAllocation *)&StagingBufferMemory);
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)&StagingBufferMemory);
  bVar3 = VulkanUtilities::VulkanMemoryAllocation::operator_cast_to_bool(&this->m_MemoryAllocation);
  if (!bVar3) {
    LogError<true,char[48],char_const*,char[3]>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x281,(char (*) [48])"Failed to allocate memory for staging texture \'",
               (char **)&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         .m_Desc,(char (*) [3])"\'.");
  }
  memory = VulkanUtilities::VulkanMemoryPage::GetVkMemory((this->m_MemoryAllocation).Page);
  msg_4.field_2._8_8_ =
       AlignUp<unsigned_long,unsigned_long>
                 ((this->m_MemoryAllocation).UnalignedOffset,StagingBufferMemReqs.size);
  Args_1 = (char (*) [118])
           (msg_3.field_2._8_8_ + (msg_4.field_2._8_8_ - (this->m_MemoryAllocation).UnalignedOffset)
           );
  if ((char (*) [118])(this->m_MemoryAllocation).Size < Args_1) {
    FormatString<char[26],char[118]>
              ((string *)local_1a0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset)"
               ,Args_1);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x285);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  pVVar9 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&this->m_StagingBuffer);
  local_1a4 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_00,pVVar9,memory,msg_4.field_2._8_8_);
  if (local_1a4 != VK_SUCCESS) {
    pStagingData = (uint8_t *)VulkanUtilities::VkResultToString(local_1a4);
    LogError<true,char[37],char[17],char_const*>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x288,(char (*) [37])"Failed to bind staging buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)&pStagingData);
  }
  this->m_StagingDataAlignedOffset = msg_4.field_2._8_8_;
  if (bVar12) {
    puVar10 = GetStagingDataCPUAddress(this);
    mip = 0;
    for (local_1c0 = 0;
        UVar4 = TextureDesc::GetArraySize
                          (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                            .m_Desc), local_1c0 < UVar4; local_1c0 = local_1c0 + 1) {
      for (SubResData._4_4_ = 0;
          SubResData._4_4_ <
          (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.MipLevels; SubResData._4_4_ = SubResData._4_4_ + 1) {
        uVar11 = (ulong)mip;
        mip = mip + 1;
        MipProps.MipSize = (Uint64)(pInitData->pSubResources + uVar11);
        GetMipLevelProperties
                  ((MipLevelProperties *)&DstSubresOffset,
                   &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                    .m_Desc,SubResData._4_4_);
        UVar6 = GetStagingTextureSubresourceOffset
                          (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                            .m_Desc,local_1c0,SubResData._4_4_,0x10);
        CopyTextureSubresource
                  ((TextureSubResData *)MipProps.MipSize,
                   MipProps.LogicalHeight / FmtAttribs->BlockHeight,MipProps.StorageWidth,
                   MipProps._16_8_,puVar10 + UVar6,MipProps._16_8_,MipProps.RowSize);
      }
    }
  }
  std::__cxx11::string::~string(local_100);
  return;
}

Assistant:

void TextureVkImpl::CreateStagingTexture(const TextureData* pInitData, const TextureFormatAttribs& FmtAttribs)
{
    const bool                                  bInitializeTexture = (pInitData != nullptr && pInitData->pSubResources != nullptr && pInitData->NumSubresources > 0);
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice      = GetDevice()->GetLogicalDevice();

    VkBufferCreateInfo VkStagingBuffCI = {};

    VkStagingBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkStagingBuffCI.pNext = nullptr;
    VkStagingBuffCI.flags = 0;
    VkStagingBuffCI.size  = GetStagingTextureDataSize(m_Desc, StagingBufferOffsetAlignment);

    // clang-format off
        DEV_CHECK_ERR((m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_READ ||
                      (m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_WRITE,
                      "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
    // clang-format on
    VkMemoryPropertyFlags MemProperties = VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;
    if (m_Desc.CPUAccessFlags & CPU_ACCESS_READ)
    {
        DEV_CHECK_ERR(!bInitializeTexture, "Readback textures should not be initialized with data");

        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_DST_BIT;
        MemProperties |= VK_MEMORY_PROPERTY_HOST_CACHED_BIT;
        SetState(RESOURCE_STATE_COPY_DEST);

        // We do not set HOST_COHERENT bit, so we will have to use InvalidateMappedMemoryRanges,
        // which requires the ranges to be aligned by nonCoherentAtomSize.
        const VkPhysicalDeviceLimits& DeviceLimits = GetDevice()->GetPhysicalDevice().GetProperties().limits;
        // Align the buffer size to ensure that any aligned range is always in bounds.
        VkStagingBuffCI.size = AlignUp(VkStagingBuffCI.size, DeviceLimits.nonCoherentAtomSize);
    }
    else if (m_Desc.CPUAccessFlags & CPU_ACCESS_WRITE)
    {
        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
        // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
        // to the host (10.2)
        MemProperties |= VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
        SetState(RESOURCE_STATE_COPY_SOURCE);
    }
    else
        UNEXPECTED("Unexpected CPU access");

    VkStagingBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    VkStagingBuffCI.queueFamilyIndexCount = 0;
    VkStagingBuffCI.pQueueFamilyIndices   = nullptr;

    std::string StagingBufferName = "Staging buffer for '";
    StagingBufferName += m_Desc.Name;
    StagingBufferName += '\'';
    m_StagingBuffer = LogicalDevice.CreateBuffer(VkStagingBuffCI, StagingBufferName.c_str());

    VkMemoryRequirements StagingBufferMemReqs = LogicalDevice.GetBufferMemoryRequirements(m_StagingBuffer);
    VERIFY(IsPowerOfTwo(StagingBufferMemReqs.alignment), "Alignment is not power of 2!");

    m_MemoryAllocation = GetDevice()->AllocateMemory(StagingBufferMemReqs, MemProperties);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for staging texture '", m_Desc.Name, "'.");

    VkDeviceMemory StagingBufferMemory     = m_MemoryAllocation.Page->GetVkMemory();
    VkDeviceSize   AlignedStagingMemOffset = AlignUp(m_MemoryAllocation.UnalignedOffset, StagingBufferMemReqs.alignment);
    VERIFY_EXPR(m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset));

    VkResult err = LogicalDevice.BindBufferMemory(m_StagingBuffer, StagingBufferMemory, AlignedStagingMemOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind staging buffer memory");

    m_StagingDataAlignedOffset = AlignedStagingMemOffset;

    if (bInitializeTexture)
    {
        uint8_t* const pStagingData = GetStagingDataCPUAddress();

        Uint32 subres = 0;
        for (Uint32 layer = 0; layer < m_Desc.GetArraySize(); ++layer)
        {
            for (Uint32 mip = 0; mip < m_Desc.MipLevels; ++mip)
            {
                const TextureSubResData& SubResData = pInitData->pSubResources[subres++];
                const MipLevelProperties MipProps   = GetMipLevelProperties(m_Desc, mip);

                const Uint64 DstSubresOffset =
                    GetStagingTextureSubresourceOffset(m_Desc, layer, mip, StagingBufferOffsetAlignment);

                CopyTextureSubresource(SubResData,
                                       MipProps.StorageHeight / FmtAttribs.BlockHeight, // NumRows
                                       MipProps.Depth,
                                       MipProps.RowSize,
                                       pStagingData + DstSubresOffset,
                                       MipProps.RowSize,       // DstRowStride
                                       MipProps.DepthSliceSize // DstDepthStride
                );
            }
        }
    }
}